

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBuiltinFunctions.hpp
# Opt level: O2

bool rsg::SqrtOp::transformValueRange(float outMin,float outMax,float *inMin,float *inMax)

{
  bool bVar1;
  
  bVar1 = outMin <= 4.0 && 0.0 <= outMax;
  if (bVar1) {
    if (4.0 <= outMax) {
      outMax = 4.0;
    }
    *inMin = (float)(-(uint)(0.0 <= outMin) & (uint)outMin);
    *inMax = outMax;
    *inMin = *inMin * *inMin;
    *inMax = *inMax * *inMax;
  }
  return bVar1;
}

Assistant:

static inline bool transformValueRange (float outMin, float outMax, float& inMin, float& inMax)
	{
		// Limited due to accuracy reasons, should be 0..+inf
		const float rangeMin = 0.0f;
		const float rangeMax = 4.0f;

		if (outMax < rangeMin || outMin > rangeMax)
			return false; // Out of range

		inMin = deFloatMax(outMin, rangeMin);
		inMax = deFloatMin(outMax, rangeMax);

		inMin *= inMin;
		inMax *= inMax;

		return true;
	}